

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O3

bool __thiscall OpenMD::Globals::addComponent(Globals *this,Component *comp)

{
  pointer *pppCVar1;
  iterator __position;
  Component *local_8;
  
  __position._M_current =
       (this->components_).
       super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->components_).
      super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = comp;
    std::vector<OpenMD::Component*,std::allocator<OpenMD::Component*>>::
    _M_realloc_insert<OpenMD::Component*const&>
              ((vector<OpenMD::Component*,std::allocator<OpenMD::Component*>> *)&this->components_,
               __position,&local_8);
  }
  else {
    *__position._M_current = comp;
    pppCVar1 = &(this->components_).
                super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return true;
}

Assistant:

bool Globals::addComponent(Component* comp) {
    components_.push_back(comp);
    return true;
  }